

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O0

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  kmp_info_t **ppkVar1;
  int iVar2;
  kmp_info_t *in_RSI;
  undefined8 *in_RDI;
  bufsize b;
  bufsize a;
  kmp_info_t *th;
  double local_28;
  kmp_info_t *in_stack_ffffffffffffffe0;
  kmp_info_t *max_free;
  
  ppkVar1 = __kmp_threads;
  iVar2 = __kmp_get_global_thread_id();
  max_free = ppkVar1[iVar2];
  __kmp_bget_dequeue(in_stack_ffffffffffffffe0);
  bcheck(in_RSI,(bufsize *)max_free->th_pad,(bufsize *)in_stack_ffffffffffffffe0->th_pad);
  *in_RDI = in_stack_ffffffffffffffe0;
  in_RSI->th_align = local_28;
  return;
}

Assistant:

void
kmpc_get_poolstat( size_t *maxmem, size_t *allmem )
{
    kmp_info_t *th = __kmp_get_thread();
    bufsize a, b;

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    bcheck( th, &a, &b );

    *maxmem = a;
    *allmem = b;
}